

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tests_impl.h
# Opt level: O1

void run_ellswift_tests(void)

{
  byte bVar1;
  byte bVar2;
  uint uVar3;
  int iVar4;
  int iVar5;
  uchar *ell_b64;
  secp256k1_fe *x_in;
  ulong uVar6;
  secp256k1_context *a;
  long lVar7;
  secp256k1_context *output;
  secp256k1_context *r;
  code *r_00;
  secp256k1_context *psVar8;
  ulong uVar9;
  secp256k1_context *b;
  ulong uVar10;
  secp256k1_context *unaff_R14;
  ulong uVar11;
  uchar *puVar12;
  ulong uVar13;
  bool bVar14;
  secp256k1_fe sStackY_c30;
  secp256k1_fe sStackY_c00;
  secp256k1_context *psStackY_bd8;
  secp256k1_context *psStackY_bd0;
  secp256k1_context *psStackY_bc8;
  secp256k1_context *psStackY_bc0;
  secp256k1_context *local_ba0;
  uchar share32_bad [32];
  uchar share32 [32];
  secp256k1_scalar sec;
  uchar sec32b_bad [32];
  uchar share32b [32];
  uchar share32a [32];
  uchar sec32 [32];
  uchar rnd32 [32];
  uint64_t local_a68;
  secp256k1_scalar sec_1;
  secp256k1_gej res;
  uchar ell64_1 [64];
  uchar auxrnd32 [32];
  secp256k1_pubkey pubkey2;
  secp256k1_scalar secb;
  secp256k1_scalar seca;
  uchar ell64 [64];
  secp256k1_fe x2;
  secp256k1_fe t;
  uint uStack_420;
  
  psVar8 = (secp256k1_context *)ellswift_xswiftec_inv_tests[0].encs;
  a = (secp256k1_context *)0x0;
  do {
    x_in = &ellswift_xswiftec_inv_tests[(long)a].x;
    r_00 = (code *)&ellswift_xswiftec_inv_tests[(long)a].u;
    lVar7 = 0;
    b = psVar8;
    do {
      r = (secp256k1_context *)&t;
      output = (secp256k1_context *)x_in;
      uVar3 = secp256k1_ellswift_xswiftec_inv_var
                        ((secp256k1_fe *)r,x_in,(secp256k1_fe *)r_00,(uint)lVar7);
      if (uVar3 != (((uint)ellswift_xswiftec_inv_tests[(long)a].enc_bitmap >> ((uint)lVar7 & 0x1f) &
                    1) != 0)) {
        run_ellswift_tests_cold_1();
LAB_00125889:
        run_ellswift_tests_cold_3();
LAB_0012588e:
        run_ellswift_tests_cold_2();
        goto LAB_00125893;
      }
      if (uVar3 != 0) {
        r = (secp256k1_context *)&t;
        output = b;
        iVar4 = check_fe_equal((secp256k1_fe *)r,(secp256k1_fe *)b);
        if (iVar4 == 0) goto LAB_00125889;
        unaff_R14 = (secp256k1_context *)&x2;
        secp256k1_ellswift_xswiftec_var
                  ((secp256k1_fe *)unaff_R14,(secp256k1_fe *)r_00,(secp256k1_fe *)b);
        output = unaff_R14;
        r = (secp256k1_context *)x_in;
        iVar4 = check_fe_equal(x_in,(secp256k1_fe *)unaff_R14);
        if (iVar4 != 0) goto LAB_00124bfb;
        goto LAB_0012588e;
      }
LAB_00124bfb:
      lVar7 = lVar7 + 1;
      b = (secp256k1_context *)&(b->ecmult_gen_ctx).initial;
    } while (lVar7 != 8);
    a = (secp256k1_context *)((long)&(a->ecmult_gen_ctx).built + 1);
    psVar8 = (secp256k1_context *)&psVar8[1].declassify;
  } while (a != (secp256k1_context *)0x20);
  a = (secp256k1_context *)&ellswift_decode_tests[0].x;
  lVar7 = 0x4c;
  r_00 = (code *)&x2;
  unaff_R14 = (secp256k1_context *)&t;
  do {
    output = (secp256k1_context *)r_00;
    r = CTX;
    iVar4 = secp256k1_ellswift_decode
                      (CTX,(secp256k1_pubkey *)r_00,(uchar *)(a[-1].ecmult_gen_ctx.initial.z.n + 3))
    ;
    b = psVar8;
    if (iVar4 == 0) goto LAB_00125893;
    output = unaff_R14;
    r = CTX;
    iVar4 = secp256k1_pubkey_load(CTX,(secp256k1_ge *)unaff_R14,(secp256k1_pubkey *)r_00);
    if (iVar4 == 0) goto LAB_00125898;
    output = unaff_R14;
    r = a;
    iVar4 = check_fe_equal((secp256k1_fe *)a,(secp256k1_fe *)unaff_R14);
    if (iVar4 == 0) goto LAB_0012589d;
    if ((uStack_420 & 1) != (uint)(a->ecmult_gen_ctx).initial.x.n[0]) goto LAB_001258a2;
    a = (secp256k1_context *)((a->ecmult_gen_ctx).initial.y.n + 4);
    lVar7 = lVar7 + -1;
  } while (lVar7 != 0);
  a = (secp256k1_context *)ellswift_xdh_tests_bip324[0].shared_secret;
  unaff_R14 = (secp256k1_context *)0x0;
  r_00 = ellswift_xdh_hash_function_bip324;
  do {
    bVar14 = ellswift_xdh_tests_bip324[(long)unaff_R14].initiating == 0;
    ell_b64 = ellswift_xdh_tests_bip324[(long)unaff_R14].ellswift_theirs;
    puVar12 = ellswift_xdh_tests_bip324[(long)unaff_R14].ellswift_ours;
    if (bVar14) {
      ell_b64 = ellswift_xdh_tests_bip324[(long)unaff_R14].ellswift_ours;
      puVar12 = ellswift_xdh_tests_bip324[(long)unaff_R14].ellswift_theirs;
    }
    output = (secp256k1_context *)&t;
    psStackY_bc0 = (secp256k1_context *)0x124d00;
    r = CTX;
    iVar4 = secp256k1_ellswift_xdh
                      (CTX,(uchar *)output,puVar12,ell_b64,
                       ellswift_xdh_tests_bip324[(long)unaff_R14].priv_ours,(uint)bVar14,
                       ellswift_xdh_hash_function_bip324,(void *)0x0);
    if (iVar4 == 0) goto LAB_001258a7;
    lVar7 = 0;
    do {
      bVar1 = *(byte *)((long)t.n + lVar7);
      output = (secp256k1_context *)(ulong)bVar1;
      bVar2 = *(byte *)((long)(a->ecmult_gen_ctx).blind.d + lVar7 + -8);
      r = (secp256k1_context *)(ulong)bVar2;
      iVar4 = (uint)bVar1 - (uint)bVar2;
      if (bVar1 != bVar2) goto LAB_00124d33;
      lVar7 = lVar7 + 1;
    } while (lVar7 != 0x20);
    iVar4 = 0;
LAB_00124d33:
    if (iVar4 != 0) goto LAB_001258ac;
    unaff_R14 = (secp256k1_context *)((long)&(unaff_R14->ecmult_gen_ctx).built + 1);
    a = (secp256k1_context *)((long)&(a->error_callback).data + 4);
  } while (unaff_R14 != (secp256k1_context *)0x7);
  if (0 < COUNT) {
    iVar4 = 0;
    do {
      random_group_element_test((secp256k1_ge *)&t);
      secp256k1_ge_to_storage((secp256k1_ge_storage *)&res,(secp256k1_ge *)&t);
      secp256k1_testrand256(rnd32);
      secp256k1_ellswift_encode(CTX,ell64,(secp256k1_pubkey *)&res,rnd32);
      secp256k1_ellswift_decode(CTX,&pubkey2,ell64);
      secp256k1_pubkey_load(CTX,(secp256k1_ge *)&x2,&pubkey2);
      ge_equals_ge((secp256k1_ge *)&t,(secp256k1_ge *)&x2);
      iVar4 = iVar4 + 1;
    } while (SBORROW4(iVar4,COUNT * 1000) != iVar4 + COUNT * -1000 < 0);
  }
  if (0 < COUNT) {
    r_00 = (code *)0x0;
    a = (secp256k1_context *)&sec;
    unaff_R14 = (secp256k1_context *)&res;
    do {
      if (((ulong)r_00 & 1) == 0) {
        puVar12 = (uchar *)0x0;
      }
      else {
        puVar12 = auxrnd32;
        secp256k1_testrand_bytes_test(puVar12,0x20);
      }
      random_scalar_order_test((secp256k1_scalar *)a);
      b = (secp256k1_context *)sec32;
      secp256k1_scalar_get_b32((uchar *)b,(secp256k1_scalar *)a);
      output = (secp256k1_context *)ell64_1;
      r = CTX;
      iVar4 = secp256k1_ellswift_create(CTX,ell64_1,(uchar *)b,puVar12);
      if (iVar4 == 0) goto LAB_001258b1;
      secp256k1_ellswift_decode(CTX,(secp256k1_pubkey *)rnd32,ell64_1);
      secp256k1_pubkey_load(CTX,(secp256k1_ge *)&pubkey2,(secp256k1_pubkey *)rnd32);
      share32._0_8_ = ell64;
      share32._8_8_ = &x2;
      share32._16_8_ = &t;
      secp256k1_ecmult_strauss_wnaf
                ((secp256k1_strauss_state *)share32,(secp256k1_gej *)unaff_R14,1,
                 (secp256k1_gej *)0x0,&secp256k1_scalar_zero,(secp256k1_scalar *)a);
      ge_equals_gej((secp256k1_ge *)&pubkey2,(secp256k1_gej *)unaff_R14);
      uVar3 = (int)r_00 + 1;
      r_00 = (code *)(ulong)uVar3;
    } while (SBORROW4(uVar3,COUNT * 400) != (int)(uVar3 + COUNT * -400) < 0);
  }
  if (0 < COUNT) {
    b = (secp256k1_context *)0x0;
    a = (secp256k1_context *)share32;
    do {
      random_scalar_order_test(&sec_1);
      secp256k1_scalar_get_b32((uchar *)&sec,&sec_1);
      unaff_R14 = (secp256k1_context *)ell64_1;
      secp256k1_testrand_bytes_test((uchar *)unaff_R14,0x20);
      secp256k1_testrand_bytes_test(ell64_1 + 0x20,0x20);
      secp256k1_ellswift_decode(CTX,(secp256k1_pubkey *)auxrnd32,(uchar *)unaff_R14);
      secp256k1_pubkey_load(CTX,(secp256k1_ge *)rnd32,(secp256k1_pubkey *)auxrnd32);
      res.x.n[4] = local_a68;
      res.x.n[2]._0_1_ = rnd32[0x10];
      res.x.n[2]._1_1_ = rnd32[0x11];
      res.x.n[2]._2_1_ = rnd32[0x12];
      res.x.n[2]._3_1_ = rnd32[0x13];
      res.x.n[2]._4_1_ = rnd32[0x14];
      res.x.n[2]._5_1_ = rnd32[0x15];
      res.x.n[2]._6_1_ = rnd32[0x16];
      res.x.n[2]._7_1_ = rnd32[0x17];
      res.x.n[3]._0_1_ = rnd32[0x18];
      res.x.n[3]._1_1_ = rnd32[0x19];
      res.x.n[3]._2_1_ = rnd32[0x1a];
      res.x.n[3]._3_1_ = rnd32[0x1b];
      res.x.n[3]._4_1_ = rnd32[0x1c];
      res.x.n[3]._5_1_ = rnd32[0x1d];
      res.x.n[3]._6_1_ = rnd32[0x1e];
      res.x.n[3]._7_1_ = rnd32[0x1f];
      res.x.n[0]._0_1_ = rnd32[0];
      res.x.n[0]._1_1_ = rnd32[1];
      res.x.n[0]._2_1_ = rnd32[2];
      res.x.n[0]._3_1_ = rnd32[3];
      res.x.n[0]._4_1_ = rnd32[4];
      res.x.n[0]._5_1_ = rnd32[5];
      res.x.n[0]._6_1_ = rnd32[6];
      res.x.n[0]._7_1_ = rnd32[7];
      res.x.n[1]._0_1_ = rnd32[8];
      res.x.n[1]._1_1_ = rnd32[9];
      res.x.n[1]._2_1_ = rnd32[10];
      res.x.n[1]._3_1_ = rnd32[0xb];
      res.x.n[1]._4_1_ = rnd32[0xc];
      res.x.n[1]._5_1_ = rnd32[0xd];
      res.x.n[1]._6_1_ = rnd32[0xe];
      res.x.n[1]._7_1_ = rnd32[0xf];
      res.z.n[0] = 1;
      res.z.n[3] = 0;
      res.z.n[4] = 0;
      res.z.n[1] = 0;
      res.z.n[2] = 0;
      psStackY_bc0 = (secp256k1_context *)0x125052;
      output = a;
      r = CTX;
      iVar4 = secp256k1_ellswift_xdh
                        (CTX,(uchar *)a,(uchar *)unaff_R14,(uchar *)unaff_R14,(uchar *)&sec,
                         (uint)b & 1,ellswift_xdh_hash_x32,(void *)0x0);
      r_00 = (code *)a;
      if (iVar4 == 0) goto LAB_001258b6;
      unaff_R14 = (secp256k1_context *)sec32;
      secp256k1_fe_impl_set_b32_mod((secp256k1_fe *)unaff_R14,(uchar *)a);
      sec32b_bad._0_8_ = ell64;
      sec32b_bad._8_8_ = &x2;
      r = (secp256k1_context *)&t;
      r_00 = (code *)&pubkey2;
      sec32b_bad._16_8_ = r;
      secp256k1_ecmult_strauss_wnaf
                ((secp256k1_strauss_state *)sec32b_bad,(secp256k1_gej *)r_00,1,&res,&sec_1,
                 (secp256k1_scalar *)0x0);
      secp256k1_ge_set_gej((secp256k1_ge *)r,(secp256k1_gej *)r_00);
      output = unaff_R14;
      iVar4 = check_fe_equal((secp256k1_fe *)r,(secp256k1_fe *)unaff_R14);
      if (iVar4 == 0) goto LAB_001258bb;
      uVar3 = (uint)b + 1;
      b = (secp256k1_context *)(ulong)uVar3;
    } while (SBORROW4(uVar3,COUNT * 800) != (int)(uVar3 + COUNT * -800) < 0);
  }
  if (0 < COUNT) {
    uVar6 = 0;
    do {
      iVar4 = (int)uVar6 + (int)(uVar6 / 3) * -3;
      if (iVar4 == 0) {
        local_ba0 = (secp256k1_context *)ellswift_xdh_hash_x32;
LAB_00125148:
        a = (secp256k1_context *)0x0;
      }
      else {
        if (iVar4 == 1) {
          local_ba0 = (secp256k1_context *)ellswift_xdh_hash_function_bip324;
          goto LAB_00125148;
        }
        a = (secp256k1_context *)&pubkey2;
        secp256k1_testrand_bytes_test((uchar *)a,0x20);
        secp256k1_testrand_bytes_test(pubkey2.data + 0x20,0x20);
        local_ba0 = (secp256k1_context *)ellswift_xdh_hash_function_prefix;
      }
      unaff_R14 = (secp256k1_context *)rnd32;
      secp256k1_testrand_bytes_test((uchar *)unaff_R14,0x20);
      secp256k1_testrand_bytes_test(ell64_1,0x20);
      random_scalar_order_test(&seca);
      random_scalar_order(&secb);
      r_00 = (code *)&sec;
      secp256k1_scalar_get_b32((uchar *)r_00,&seca);
      b = (secp256k1_context *)share32;
      secp256k1_scalar_get_b32((uchar *)b,&secb);
      output = (secp256k1_context *)&t;
      r = CTX;
      iVar5 = secp256k1_ellswift_create(CTX,(uchar *)&t,(uchar *)r_00,(uchar *)unaff_R14);
      if (iVar5 == 0) goto LAB_001258c0;
      unaff_R14 = (secp256k1_context *)&x2;
      output = unaff_R14;
      r = CTX;
      iVar5 = secp256k1_ellswift_create(CTX,(uchar *)unaff_R14,(uchar *)b,ell64_1);
      if (iVar5 == 0) goto LAB_001258c5;
      output = (secp256k1_context *)share32a;
      psStackY_bc0 = (secp256k1_context *)0x125262;
      r = CTX;
      iVar5 = secp256k1_ellswift_xdh
                        (CTX,(uchar *)output,(uchar *)&t,(uchar *)unaff_R14,(uchar *)&sec,0,
                         (secp256k1_ellswift_xdh_hash_function)local_ba0,a);
      if (iVar5 == 0) goto LAB_001258ca;
      output = (secp256k1_context *)share32b;
      psStackY_bc0 = (secp256k1_context *)0x125294;
      r = CTX;
      iVar5 = secp256k1_ellswift_xdh
                        (CTX,(uchar *)output,(uchar *)&t,(uchar *)unaff_R14,(uchar *)b,1,
                         (secp256k1_ellswift_xdh_hash_function)local_ba0,a);
      if (iVar5 == 0) goto LAB_001258cf;
      lVar7 = 0;
      do {
        bVar1 = share32a[lVar7];
        output = (secp256k1_context *)(ulong)bVar1;
        bVar2 = share32b[lVar7];
        r = (secp256k1_context *)(ulong)bVar2;
        iVar5 = (uint)bVar1 - (uint)bVar2;
        if (bVar1 != bVar2) goto LAB_001252d3;
        lVar7 = lVar7 + 1;
      } while (lVar7 != 0x20);
      iVar5 = 0;
LAB_001252d3:
      if (iVar5 != 0) goto LAB_001258d4;
      res.x.n[4] = x2.n[4];
      res.x.n[2] = x2.n[2];
      res.x.n[3] = x2.n[3];
      res.x.n[0] = x2.n[0];
      res.x.n[1] = x2.n[1];
      secp256k1_testrand_flip((uchar *)&res,0x40);
      output = (secp256k1_context *)share32_bad;
      psStackY_bc0 = (secp256k1_context *)0x12534a;
      r = CTX;
      iVar5 = secp256k1_ellswift_xdh
                        (CTX,(uchar *)output,(uchar *)&t,(uchar *)&res,(uchar *)&sec,0,
                         (secp256k1_ellswift_xdh_hash_function)local_ba0,a);
      if (iVar5 == 0) goto LAB_001258d9;
      lVar7 = 0;
      do {
        bVar1 = share32_bad[lVar7];
        output = (secp256k1_context *)(ulong)bVar1;
        bVar2 = share32a[lVar7];
        r = (secp256k1_context *)(ulong)bVar2;
        iVar5 = (uint)bVar1 - (uint)bVar2;
        if (bVar1 != bVar2) goto LAB_0012537e;
        lVar7 = lVar7 + 1;
      } while (lVar7 != 0x20);
      iVar5 = 0;
LAB_0012537e:
      if (iVar5 == 0) goto LAB_001258de;
      ell64[0x20] = (undefined1)t.n[4];
      ell64[0x21] = t.n[4]._1_1_;
      ell64[0x22] = t.n[4]._2_1_;
      ell64[0x23] = t.n[4]._3_1_;
      ell64[0x24] = t.n[4]._4_1_;
      ell64[0x25] = t.n[4]._5_1_;
      ell64[0x26] = t.n[4]._6_1_;
      ell64[0x27] = t.n[4]._7_1_;
      ell64[0x10] = (undefined1)t.n[2];
      ell64[0x11] = t.n[2]._1_1_;
      ell64[0x12] = t.n[2]._2_1_;
      ell64[0x13] = t.n[2]._3_1_;
      ell64[0x14] = t.n[2]._4_1_;
      ell64[0x15] = t.n[2]._5_1_;
      ell64[0x16] = t.n[2]._6_1_;
      ell64[0x17] = t.n[2]._7_1_;
      ell64[0x18] = (undefined1)t.n[3];
      ell64[0x19] = t.n[3]._1_1_;
      ell64[0x1a] = t.n[3]._2_1_;
      ell64[0x1b] = t.n[3]._3_1_;
      ell64[0x1c] = t.n[3]._4_1_;
      ell64[0x1d] = t.n[3]._5_1_;
      ell64[0x1e] = t.n[3]._6_1_;
      ell64[0x1f] = t.n[3]._7_1_;
      ell64[0] = (undefined1)t.n[0];
      ell64[1] = t.n[0]._1_1_;
      ell64[2] = t.n[0]._2_1_;
      ell64[3] = t.n[0]._3_1_;
      ell64[4] = t.n[0]._4_1_;
      ell64[5] = t.n[0]._5_1_;
      ell64[6] = t.n[0]._6_1_;
      ell64[7] = t.n[0]._7_1_;
      ell64[8] = (undefined1)t.n[1];
      ell64[9] = t.n[1]._1_1_;
      ell64[10] = t.n[1]._2_1_;
      ell64[0xb] = t.n[1]._3_1_;
      ell64[0xc] = t.n[1]._4_1_;
      ell64[0xd] = t.n[1]._5_1_;
      ell64[0xe] = t.n[1]._6_1_;
      ell64[0xf] = t.n[1]._7_1_;
      secp256k1_testrand_flip(ell64,0x40);
      output = (secp256k1_context *)share32_bad;
      psStackY_bc0 = (secp256k1_context *)0x1253fe;
      r = CTX;
      iVar5 = secp256k1_ellswift_xdh
                        (CTX,(uchar *)output,ell64,(uchar *)unaff_R14,(uchar *)b,1,
                         (secp256k1_ellswift_xdh_hash_function)local_ba0,a);
      if (iVar5 == 0) goto LAB_001258e3;
      lVar7 = 0;
      do {
        bVar1 = share32_bad[lVar7];
        output = (secp256k1_context *)(ulong)bVar1;
        bVar2 = share32b[lVar7];
        r = (secp256k1_context *)(ulong)bVar2;
        iVar5 = (uint)bVar1 - (uint)bVar2;
        if (bVar1 != bVar2) goto LAB_00125432;
        lVar7 = lVar7 + 1;
      } while (lVar7 != 0x20);
      iVar5 = 0;
LAB_00125432:
      if (iVar5 == 0) goto LAB_001258e8;
      sec_1.d[2] = sec.d[2];
      sec_1.d[3] = sec.d[3];
      sec_1.d[0] = sec.d[0];
      sec_1.d[1] = sec.d[1];
      secp256k1_testrand_flip((uchar *)&sec_1,0x20);
      psStackY_bc0 = (secp256k1_context *)0x125489;
      iVar5 = secp256k1_ellswift_xdh
                        (CTX,share32_bad,(uchar *)&t,(uchar *)unaff_R14,(uchar *)&sec_1,0,
                         (secp256k1_ellswift_xdh_hash_function)local_ba0,a);
      if (iVar5 != 0) {
        lVar7 = 0;
        do {
          bVar1 = share32_bad[lVar7];
          output = (secp256k1_context *)(ulong)bVar1;
          bVar2 = share32a[lVar7];
          r = (secp256k1_context *)(ulong)bVar2;
          iVar5 = (uint)bVar1 - (uint)bVar2;
          if (bVar1 != bVar2) goto LAB_001254b9;
          lVar7 = lVar7 + 1;
        } while (lVar7 != 0x20);
        iVar5 = 0;
LAB_001254b9:
        if (iVar5 == 0) goto LAB_001258ed;
      }
      sec32b_bad[0x10] = share32[0x10];
      sec32b_bad[0x11] = share32[0x11];
      sec32b_bad[0x12] = share32[0x12];
      sec32b_bad[0x13] = share32[0x13];
      sec32b_bad[0x14] = share32[0x14];
      sec32b_bad[0x15] = share32[0x15];
      sec32b_bad[0x16] = share32[0x16];
      sec32b_bad[0x17] = share32[0x17];
      sec32b_bad[0x18] = share32[0x18];
      sec32b_bad[0x19] = share32[0x19];
      sec32b_bad[0x1a] = share32[0x1a];
      sec32b_bad[0x1b] = share32[0x1b];
      sec32b_bad[0x1c] = share32[0x1c];
      sec32b_bad[0x1d] = share32[0x1d];
      sec32b_bad[0x1e] = share32[0x1e];
      sec32b_bad[0x1f] = share32[0x1f];
      sec32b_bad[0] = share32[0];
      sec32b_bad[1] = share32[1];
      sec32b_bad[2] = share32[2];
      sec32b_bad[3] = share32[3];
      sec32b_bad[4] = share32[4];
      sec32b_bad[5] = share32[5];
      sec32b_bad[6] = share32[6];
      sec32b_bad[7] = share32[7];
      sec32b_bad[8] = share32[8];
      sec32b_bad[9] = share32[9];
      sec32b_bad[10] = share32[10];
      sec32b_bad[0xb] = share32[0xb];
      sec32b_bad[0xc] = share32[0xc];
      sec32b_bad[0xd] = share32[0xd];
      sec32b_bad[0xe] = share32[0xe];
      sec32b_bad[0xf] = share32[0xf];
      secp256k1_testrand_flip(sec32b_bad,0x20);
      psStackY_bc0 = (secp256k1_context *)0x125513;
      iVar5 = secp256k1_ellswift_xdh
                        (CTX,share32_bad,(uchar *)&t,(uchar *)unaff_R14,sec32b_bad,1,
                         (secp256k1_ellswift_xdh_hash_function)local_ba0,a);
      if (iVar5 != 0) {
        lVar7 = 0;
        do {
          bVar1 = share32_bad[lVar7];
          output = (secp256k1_context *)(ulong)bVar1;
          bVar2 = share32b[lVar7];
          r = (secp256k1_context *)(ulong)bVar2;
          iVar5 = (uint)bVar1 - (uint)bVar2;
          if (bVar1 != bVar2) goto LAB_00125543;
          lVar7 = lVar7 + 1;
        } while (lVar7 != 0x20);
        iVar5 = 0;
LAB_00125543:
        if (iVar5 == 0) goto LAB_001258f2;
      }
      if (iVar4 != 0) {
        sec32[0x10] = ell64_1[0x10];
        sec32[0x11] = ell64_1[0x11];
        sec32[0x12] = ell64_1[0x12];
        sec32[0x13] = ell64_1[0x13];
        sec32[0x14] = ell64_1[0x14];
        sec32[0x15] = ell64_1[0x15];
        sec32[0x16] = ell64_1[0x16];
        sec32[0x17] = ell64_1[0x17];
        sec32[0x18] = ell64_1[0x18];
        sec32[0x19] = ell64_1[0x19];
        sec32[0x1a] = ell64_1[0x1a];
        sec32[0x1b] = ell64_1[0x1b];
        sec32[0x1c] = ell64_1[0x1c];
        sec32[0x1d] = ell64_1[0x1d];
        sec32[0x1e] = ell64_1[0x1e];
        sec32[0x1f] = ell64_1[0x1f];
        sec32[0] = ell64_1[0];
        sec32[1] = ell64_1[1];
        sec32[2] = ell64_1[2];
        sec32[3] = ell64_1[3];
        sec32[4] = ell64_1[4];
        sec32[5] = ell64_1[5];
        sec32[6] = ell64_1[6];
        sec32[7] = ell64_1[7];
        sec32[8] = ell64_1[8];
        sec32[9] = ell64_1[9];
        sec32[10] = ell64_1[10];
        sec32[0xb] = ell64_1[0xb];
        sec32[0xc] = ell64_1[0xc];
        sec32[0xd] = ell64_1[0xd];
        sec32[0xe] = ell64_1[0xe];
        sec32[0xf] = ell64_1[0xf];
        secp256k1_testrand_flip(sec32,0x20);
        b = (secp256k1_context *)&res;
        output = b;
        r = CTX;
        iVar4 = secp256k1_ellswift_create(CTX,(uchar *)b,share32,sec32);
        if (iVar4 == 0) goto LAB_001258f7;
        output = (secp256k1_context *)share32_bad;
        psStackY_bc0 = (secp256k1_context *)0x1255d4;
        r = CTX;
        iVar4 = secp256k1_ellswift_xdh
                          (CTX,(uchar *)output,(uchar *)&t,(uchar *)b,(uchar *)&sec,0,
                           (secp256k1_ellswift_xdh_hash_function)local_ba0,a);
        if (iVar4 == 0) goto LAB_001258fc;
        lVar7 = 0;
        b = (secp256k1_context *)share32;
        do {
          bVar1 = share32_bad[lVar7];
          output = (secp256k1_context *)(ulong)bVar1;
          bVar2 = share32a[lVar7];
          r = (secp256k1_context *)(ulong)bVar2;
          iVar4 = (uint)bVar1 - (uint)bVar2;
          if (bVar1 != bVar2) goto LAB_00125615;
          lVar7 = lVar7 + 1;
        } while (lVar7 != 0x20);
        iVar4 = 0;
LAB_00125615:
        psVar8 = local_ba0;
        if (iVar4 == 0) goto LAB_00125901;
        auxrnd32[0x10] = rnd32[0x10];
        auxrnd32[0x11] = rnd32[0x11];
        auxrnd32[0x12] = rnd32[0x12];
        auxrnd32[0x13] = rnd32[0x13];
        auxrnd32[0x14] = rnd32[0x14];
        auxrnd32[0x15] = rnd32[0x15];
        auxrnd32[0x16] = rnd32[0x16];
        auxrnd32[0x17] = rnd32[0x17];
        auxrnd32[0x18] = rnd32[0x18];
        auxrnd32[0x19] = rnd32[0x19];
        auxrnd32[0x1a] = rnd32[0x1a];
        auxrnd32[0x1b] = rnd32[0x1b];
        auxrnd32[0x1c] = rnd32[0x1c];
        auxrnd32[0x1d] = rnd32[0x1d];
        auxrnd32[0x1e] = rnd32[0x1e];
        auxrnd32[0x1f] = rnd32[0x1f];
        auxrnd32[0] = rnd32[0];
        auxrnd32[1] = rnd32[1];
        auxrnd32[2] = rnd32[2];
        auxrnd32[3] = rnd32[3];
        auxrnd32[4] = rnd32[4];
        auxrnd32[5] = rnd32[5];
        auxrnd32[6] = rnd32[6];
        auxrnd32[7] = rnd32[7];
        auxrnd32[8] = rnd32[8];
        auxrnd32[9] = rnd32[9];
        auxrnd32[10] = rnd32[10];
        auxrnd32[0xb] = rnd32[0xb];
        auxrnd32[0xc] = rnd32[0xc];
        auxrnd32[0xd] = rnd32[0xd];
        auxrnd32[0xe] = rnd32[0xe];
        auxrnd32[0xf] = rnd32[0xf];
        psVar8 = (secp256k1_context *)auxrnd32;
        secp256k1_testrand_flip((uchar *)psVar8,0x20);
        output = (secp256k1_context *)ell64;
        r = CTX;
        iVar4 = secp256k1_ellswift_create(CTX,ell64,(uchar *)&sec,(uchar *)psVar8);
        if (iVar4 == 0) goto LAB_00125906;
        output = (secp256k1_context *)share32_bad;
        psStackY_bc0 = (secp256k1_context *)0x125699;
        r = CTX;
        iVar4 = secp256k1_ellswift_xdh
                          (CTX,(uchar *)output,ell64,(uchar *)unaff_R14,(uchar *)b,1,
                           (secp256k1_ellswift_xdh_hash_function)local_ba0,a);
        if (iVar4 == 0) goto LAB_0012590b;
        lVar7 = 0;
        do {
          bVar1 = share32_bad[lVar7];
          output = (secp256k1_context *)(ulong)bVar1;
          bVar2 = share32b[lVar7];
          r = (secp256k1_context *)(ulong)bVar2;
          iVar4 = (uint)bVar1 - (uint)bVar2;
          if (bVar1 != bVar2) goto LAB_001256cd;
          lVar7 = lVar7 + 1;
        } while (lVar7 != 0x20);
        iVar4 = 0;
LAB_001256cd:
        if (iVar4 == 0) goto LAB_00125910;
        output = (secp256k1_context *)share32_bad;
        psStackY_bc0 = (secp256k1_context *)0x1256fa;
        r = CTX;
        iVar4 = secp256k1_ellswift_xdh
                          (CTX,(uchar *)output,(uchar *)&t,(uchar *)unaff_R14,(uchar *)&sec,1,
                           (secp256k1_ellswift_xdh_hash_function)local_ba0,a);
        if (iVar4 == 0) goto LAB_00125915;
        lVar7 = 0;
        do {
          bVar1 = share32_bad[lVar7];
          output = (secp256k1_context *)(ulong)bVar1;
          bVar2 = share32a[lVar7];
          r = (secp256k1_context *)(ulong)bVar2;
          iVar4 = (uint)bVar1 - (uint)bVar2;
          if (bVar1 != bVar2) goto LAB_0012572e;
          lVar7 = lVar7 + 1;
        } while (lVar7 != 0x20);
        iVar4 = 0;
LAB_0012572e:
        if (iVar4 == 0) goto LAB_0012591a;
        output = (secp256k1_context *)share32_bad;
        psStackY_bc0 = (secp256k1_context *)0x125756;
        r = CTX;
        iVar4 = secp256k1_ellswift_xdh
                          (CTX,(uchar *)output,(uchar *)&t,(uchar *)unaff_R14,(uchar *)b,0,
                           (secp256k1_ellswift_xdh_hash_function)local_ba0,a);
        if (iVar4 == 0) goto LAB_0012591f;
        lVar7 = 0;
        do {
          bVar1 = share32_bad[lVar7];
          output = (secp256k1_context *)(ulong)bVar1;
          bVar2 = share32b[lVar7];
          r = (secp256k1_context *)(ulong)bVar2;
          iVar4 = (uint)bVar1 - (uint)bVar2;
          if (bVar1 != bVar2) goto LAB_0012578a;
          lVar7 = lVar7 + 1;
        } while (lVar7 != 0x20);
        iVar4 = 0;
LAB_0012578a:
        if (iVar4 == 0) goto LAB_00125924;
      }
      uVar3 = (int)uVar6 + 1;
      uVar6 = (ulong)uVar3;
    } while (SBORROW4(uVar3,COUNT * 200) != (int)(uVar3 + COUNT * -200) < 0);
  }
  secp256k1_sha256_initialize_tagged((secp256k1_sha256 *)&t,"secp256k1_ellswift_encode",0x19);
  x2.n[0] = 0x28594b3d1a6524b;
  x2.n[1] = 0x1037a17796e42f4e;
  x2.n[2] = 0x560238851b8fcb8b;
  x2.n[3] = 0xd626b7152560ede1;
  test_sha256_eq((secp256k1_sha256 *)&t,(secp256k1_sha256 *)&x2);
  secp256k1_sha256_initialize_tagged((secp256k1_sha256 *)&t,"secp256k1_ellswift_create",0x19);
  x2.n[0] = 0xf7025f42d29e1bf5;
  x2.n[1] = 0x94cb7d59b024773;
  x2.n[2] = 0x3bc9786e59ed789;
  x2.n[3] = 0x4e363b5368335b35;
  test_sha256_eq((secp256k1_sha256 *)&t,(secp256k1_sha256 *)&x2);
  secp256k1_sha256_initialize_tagged((secp256k1_sha256 *)&t,"bip324_ellswift_xonly_ecdh",0x1a);
  x2.n[0] = 0x827bd3928c12d730;
  x2.n[1] = 0x207b373e9e4fb2ee;
  x2.n[2] = 0xaa5441bc2292bd7a;
  x2.n[3] = 0xcfb5254915c3779f;
  test_sha256_eq((secp256k1_sha256 *)&t,(secp256k1_sha256 *)&x2);
  return;
LAB_00125893:
  run_ellswift_tests_cold_33();
LAB_00125898:
  run_ellswift_tests_cold_32();
LAB_0012589d:
  run_ellswift_tests_cold_31();
LAB_001258a2:
  run_ellswift_tests_cold_4();
LAB_001258a7:
  run_ellswift_tests_cold_30();
LAB_001258ac:
  run_ellswift_tests_cold_5();
LAB_001258b1:
  run_ellswift_tests_cold_29();
LAB_001258b6:
  run_ellswift_tests_cold_28();
LAB_001258bb:
  run_ellswift_tests_cold_27();
LAB_001258c0:
  run_ellswift_tests_cold_26();
LAB_001258c5:
  local_ba0 = (secp256k1_context *)r_00;
  run_ellswift_tests_cold_25();
LAB_001258ca:
  run_ellswift_tests_cold_24();
LAB_001258cf:
  run_ellswift_tests_cold_23();
LAB_001258d4:
  run_ellswift_tests_cold_6();
LAB_001258d9:
  run_ellswift_tests_cold_22();
LAB_001258de:
  run_ellswift_tests_cold_21();
LAB_001258e3:
  run_ellswift_tests_cold_20();
LAB_001258e8:
  run_ellswift_tests_cold_19();
LAB_001258ed:
  run_ellswift_tests_cold_7();
LAB_001258f2:
  run_ellswift_tests_cold_8();
LAB_001258f7:
  run_ellswift_tests_cold_18();
LAB_001258fc:
  run_ellswift_tests_cold_17();
  psVar8 = local_ba0;
LAB_00125901:
  run_ellswift_tests_cold_16();
LAB_00125906:
  run_ellswift_tests_cold_15();
LAB_0012590b:
  run_ellswift_tests_cold_14();
LAB_00125910:
  run_ellswift_tests_cold_13();
LAB_00125915:
  run_ellswift_tests_cold_12();
LAB_0012591a:
  run_ellswift_tests_cold_11();
LAB_0012591f:
  run_ellswift_tests_cold_10();
LAB_00125924:
  run_ellswift_tests_cold_9();
  uVar6 = (r->ecmult_gen_ctx).blind.d[3];
  uVar11 = (uVar6 >> 0x30) * 0x1000003d1 + *(uint64_t *)&r->ecmult_gen_ctx;
  uVar13 = (uVar11 >> 0x34) + (r->ecmult_gen_ctx).blind.d[0];
  uVar9 = (uVar13 >> 0x34) + (r->ecmult_gen_ctx).blind.d[1];
  uVar10 = (uVar9 >> 0x34) + (r->ecmult_gen_ctx).blind.d[2];
  sStackY_c30.n[4] = (output->ecmult_gen_ctx).blind.d[3];
  sStackY_c30.n[0] = *(uint64_t *)&output->ecmult_gen_ctx;
  sStackY_c30.n[1] = (output->ecmult_gen_ctx).blind.d[0];
  sStackY_c30.n[2] = (output->ecmult_gen_ctx).blind.d[1];
  sStackY_c30.n[3] = (output->ecmult_gen_ctx).blind.d[2];
  psStackY_bd8 = a;
  psStackY_bd0 = psVar8;
  psStackY_bc8 = b;
  psStackY_bc0 = unaff_R14;
  secp256k1_fe_impl_normalize_var(&sStackY_c30);
  sStackY_c00.n[0] = (sStackY_c30.n[0] - (uVar11 & 0xfffffffffffff)) + 0x3ffffbfffff0bc;
  sStackY_c00.n[1] = (0x3ffffffffffffc - (uVar13 & 0xfffffffffffff)) + sStackY_c30.n[1];
  sStackY_c00.n[2] = (0x3ffffffffffffc - (uVar9 & 0xfffffffffffff)) + sStackY_c30.n[2];
  sStackY_c00.n[3] = (0x3ffffffffffffc - (uVar10 & 0xfffffffffffff)) + sStackY_c30.n[3];
  sStackY_c00.n[4] =
       (sStackY_c30.n[4] - ((uVar10 >> 0x34) + (uVar6 & 0xffffffffffff))) + 0x3fffffffffffc;
  secp256k1_fe_impl_normalizes_to_zero_var(&sStackY_c00);
  return;
}

Assistant:

void run_ellswift_tests(void) {
    int i = 0;
    /* Test vectors. */
    for (i = 0; (unsigned)i < sizeof(ellswift_xswiftec_inv_tests) / sizeof(ellswift_xswiftec_inv_tests[0]); ++i) {
        const struct ellswift_xswiftec_inv_test *testcase = &ellswift_xswiftec_inv_tests[i];
        int c;
        for (c = 0; c < 8; ++c) {
            secp256k1_fe t;
            int ret = secp256k1_ellswift_xswiftec_inv_var(&t, &testcase->x, &testcase->u, c);
            CHECK(ret == ((testcase->enc_bitmap >> c) & 1));
            if (ret) {
                secp256k1_fe x2;
                CHECK(check_fe_equal(&t, &testcase->encs[c]));
                secp256k1_ellswift_xswiftec_var(&x2, &testcase->u, &testcase->encs[c]);
                CHECK(check_fe_equal(&testcase->x, &x2));
            }
        }
    }
    for (i = 0; (unsigned)i < sizeof(ellswift_decode_tests) / sizeof(ellswift_decode_tests[0]); ++i) {
        const struct ellswift_decode_test *testcase = &ellswift_decode_tests[i];
        secp256k1_pubkey pubkey;
        secp256k1_ge ge;
        int ret;
        ret = secp256k1_ellswift_decode(CTX, &pubkey, testcase->enc);
        CHECK(ret);
        ret = secp256k1_pubkey_load(CTX, &ge, &pubkey);
        CHECK(ret);
        CHECK(check_fe_equal(&testcase->x, &ge.x));
        CHECK(secp256k1_fe_is_odd(&ge.y) == testcase->odd_y);
    }
    for (i = 0; (unsigned)i < sizeof(ellswift_xdh_tests_bip324) / sizeof(ellswift_xdh_tests_bip324[0]); ++i) {
        const struct ellswift_xdh_test *test = &ellswift_xdh_tests_bip324[i];
        unsigned char shared_secret[32];
        int ret;
        int party = !test->initiating;
        const unsigned char* ell_a64 = party ? test->ellswift_theirs : test->ellswift_ours;
        const unsigned char* ell_b64 = party ? test->ellswift_ours   : test->ellswift_theirs;
        ret = secp256k1_ellswift_xdh(CTX, shared_secret,
                                     ell_a64, ell_b64,
                                     test->priv_ours,
                                     party,
                                     secp256k1_ellswift_xdh_hash_function_bip324,
                                     NULL);
        CHECK(ret);
        CHECK(secp256k1_memcmp_var(shared_secret, test->shared_secret, 32) == 0);
    }
    /* Verify that secp256k1_ellswift_encode + decode roundtrips. */
    for (i = 0; i < 1000 * COUNT; i++) {
        unsigned char rnd32[32];
        unsigned char ell64[64];
        secp256k1_ge g, g2;
        secp256k1_pubkey pubkey, pubkey2;
        /* Generate random public key and random randomizer. */
        random_group_element_test(&g);
        secp256k1_pubkey_save(&pubkey, &g);
        secp256k1_testrand256(rnd32);
        /* Convert the public key to ElligatorSwift and back. */
        secp256k1_ellswift_encode(CTX, ell64, &pubkey, rnd32);
        secp256k1_ellswift_decode(CTX, &pubkey2, ell64);
        secp256k1_pubkey_load(CTX, &g2, &pubkey2);
        /* Compare with original. */
        ge_equals_ge(&g, &g2);
    }
    /* Verify the behavior of secp256k1_ellswift_create */
    for (i = 0; i < 400 * COUNT; i++) {
        unsigned char auxrnd32[32], sec32[32];
        secp256k1_scalar sec;
        secp256k1_gej res;
        secp256k1_ge dec;
        secp256k1_pubkey pub;
        unsigned char ell64[64];
        int ret;
        /* Generate random secret key and random randomizer. */
        if (i & 1) secp256k1_testrand256_test(auxrnd32);
        random_scalar_order_test(&sec);
        secp256k1_scalar_get_b32(sec32, &sec);
        /* Construct ElligatorSwift-encoded public keys for that key. */
        ret = secp256k1_ellswift_create(CTX, ell64, sec32, (i & 1) ? auxrnd32 : NULL);
        CHECK(ret);
        /* Decode it, and compare with traditionally-computed public key. */
        secp256k1_ellswift_decode(CTX, &pub, ell64);
        secp256k1_pubkey_load(CTX, &dec, &pub);
        secp256k1_ecmult(&res, NULL, &secp256k1_scalar_zero, &sec);
        ge_equals_gej(&dec, &res);
    }
    /* Verify that secp256k1_ellswift_xdh computes the right shared X coordinate. */
    for (i = 0; i < 800 * COUNT; i++) {
        unsigned char ell64[64], sec32[32], share32[32];
        secp256k1_scalar sec;
        secp256k1_ge dec, res;
        secp256k1_fe share_x;
        secp256k1_gej decj, resj;
        secp256k1_pubkey pub;
        int ret;
        /* Generate random secret key. */
        random_scalar_order_test(&sec);
        secp256k1_scalar_get_b32(sec32, &sec);
        /* Generate random ElligatorSwift encoding for the remote key and decode it. */
        secp256k1_testrand256_test(ell64);
        secp256k1_testrand256_test(ell64 + 32);
        secp256k1_ellswift_decode(CTX, &pub, ell64);
        secp256k1_pubkey_load(CTX, &dec, &pub);
        secp256k1_gej_set_ge(&decj, &dec);
        /* Compute the X coordinate of seckey*pubkey using ellswift_xdh. Note that we
         * pass ell64 as claimed (but incorrect) encoding for sec32 here; this works
         * because the "hasher" function we use here ignores the ell64 arguments. */
        ret = secp256k1_ellswift_xdh(CTX, share32, ell64, ell64, sec32, i & 1, &ellswift_xdh_hash_x32, NULL);
        CHECK(ret);
        (void)secp256k1_fe_set_b32_limit(&share_x, share32); /* no overflow is possible */
        secp256k1_fe_verify(&share_x);
        /* Compute seckey*pubkey directly. */
        secp256k1_ecmult(&resj, &decj, &sec, NULL);
        secp256k1_ge_set_gej(&res, &resj);
        /* Compare. */
        CHECK(check_fe_equal(&res.x, &share_x));
    }
    /* Verify the joint behavior of secp256k1_ellswift_xdh */
    for (i = 0; i < 200 * COUNT; i++) {
        unsigned char auxrnd32a[32], auxrnd32b[32], auxrnd32a_bad[32], auxrnd32b_bad[32];
        unsigned char sec32a[32], sec32b[32], sec32a_bad[32], sec32b_bad[32];
        secp256k1_scalar seca, secb;
        unsigned char ell64a[64], ell64b[64], ell64a_bad[64], ell64b_bad[64];
        unsigned char share32a[32], share32b[32], share32_bad[32];
        unsigned char prefix64[64];
        secp256k1_ellswift_xdh_hash_function hash_function;
        void* data;
        int ret;

        /* Pick hasher to use. */
        if ((i % 3) == 0) {
            hash_function = ellswift_xdh_hash_x32;
            data = NULL;
        } else if ((i % 3) == 1) {
            hash_function = secp256k1_ellswift_xdh_hash_function_bip324;
            data = NULL;
        } else {
            hash_function = secp256k1_ellswift_xdh_hash_function_prefix;
            secp256k1_testrand256_test(prefix64);
            secp256k1_testrand256_test(prefix64 + 32);
            data = prefix64;
        }

        /* Generate random secret keys and random randomizers. */
        secp256k1_testrand256_test(auxrnd32a);
        secp256k1_testrand256_test(auxrnd32b);
        random_scalar_order_test(&seca);
        /* Draw secb uniformly at random to make sure that the secret keys
         * differ */
        random_scalar_order(&secb);
        secp256k1_scalar_get_b32(sec32a, &seca);
        secp256k1_scalar_get_b32(sec32b, &secb);

        /* Construct ElligatorSwift-encoded public keys for those keys. */
        /* For A: */
        ret = secp256k1_ellswift_create(CTX, ell64a, sec32a, auxrnd32a);
        CHECK(ret);
        /* For B: */
        ret = secp256k1_ellswift_create(CTX, ell64b, sec32b, auxrnd32b);
        CHECK(ret);

        /* Compute the shared secret both ways and compare with each other. */
        /* For A: */
        ret = secp256k1_ellswift_xdh(CTX, share32a, ell64a, ell64b, sec32a, 0, hash_function, data);
        CHECK(ret);
        /* For B: */
        ret = secp256k1_ellswift_xdh(CTX, share32b, ell64a, ell64b, sec32b, 1, hash_function, data);
        CHECK(ret);
        /* And compare: */
        CHECK(secp256k1_memcmp_var(share32a, share32b, 32) == 0);

        /* Verify that the shared secret doesn't match if other side's public key is incorrect. */
        /* For A (using a bad public key for B): */
        memcpy(ell64b_bad, ell64b, sizeof(ell64a_bad));
        secp256k1_testrand_flip(ell64b_bad, sizeof(ell64b_bad));
        ret = secp256k1_ellswift_xdh(CTX, share32_bad, ell64a, ell64b_bad, sec32a, 0, hash_function, data);
        CHECK(ret); /* Mismatching encodings don't get detected by secp256k1_ellswift_xdh. */
        CHECK(secp256k1_memcmp_var(share32_bad, share32a, 32) != 0);
        /* For B (using a bad public key for A): */
        memcpy(ell64a_bad, ell64a, sizeof(ell64a_bad));
        secp256k1_testrand_flip(ell64a_bad, sizeof(ell64a_bad));
        ret = secp256k1_ellswift_xdh(CTX, share32_bad, ell64a_bad, ell64b, sec32b, 1, hash_function, data);
        CHECK(ret);
        CHECK(secp256k1_memcmp_var(share32_bad, share32b, 32) != 0);

        /* Verify that the shared secret doesn't match if the private key is incorrect. */
        /* For A: */
        memcpy(sec32a_bad, sec32a, sizeof(sec32a_bad));
        secp256k1_testrand_flip(sec32a_bad, sizeof(sec32a_bad));
        ret = secp256k1_ellswift_xdh(CTX, share32_bad, ell64a, ell64b, sec32a_bad, 0, hash_function, data);
        CHECK(!ret || secp256k1_memcmp_var(share32_bad, share32a, 32) != 0);
        /* For B: */
        memcpy(sec32b_bad, sec32b, sizeof(sec32b_bad));
        secp256k1_testrand_flip(sec32b_bad, sizeof(sec32b_bad));
        ret = secp256k1_ellswift_xdh(CTX, share32_bad, ell64a, ell64b, sec32b_bad, 1, hash_function, data);
        CHECK(!ret || secp256k1_memcmp_var(share32_bad, share32b, 32) != 0);

        if (hash_function != ellswift_xdh_hash_x32) {
            /* Verify that the shared secret doesn't match when a different encoding of the same public key is used. */
            /* For A (changing B's public key): */
            memcpy(auxrnd32b_bad, auxrnd32b, sizeof(auxrnd32b_bad));
            secp256k1_testrand_flip(auxrnd32b_bad, sizeof(auxrnd32b_bad));
            ret = secp256k1_ellswift_create(CTX, ell64b_bad, sec32b, auxrnd32b_bad);
            CHECK(ret);
            ret = secp256k1_ellswift_xdh(CTX, share32_bad, ell64a, ell64b_bad, sec32a, 0, hash_function, data);
            CHECK(ret);
            CHECK(secp256k1_memcmp_var(share32_bad, share32a, 32) != 0);
            /* For B (changing A's public key): */
            memcpy(auxrnd32a_bad, auxrnd32a, sizeof(auxrnd32a_bad));
            secp256k1_testrand_flip(auxrnd32a_bad, sizeof(auxrnd32a_bad));
            ret = secp256k1_ellswift_create(CTX, ell64a_bad, sec32a, auxrnd32a_bad);
            CHECK(ret);
            ret = secp256k1_ellswift_xdh(CTX, share32_bad, ell64a_bad, ell64b, sec32b, 1, hash_function, data);
            CHECK(ret);
            CHECK(secp256k1_memcmp_var(share32_bad, share32b, 32) != 0);

            /* Verify that swapping sides changes the shared secret. */
            /* For A (claiming to be B): */
            ret = secp256k1_ellswift_xdh(CTX, share32_bad, ell64a, ell64b, sec32a, 1, hash_function, data);
            CHECK(ret);
            CHECK(secp256k1_memcmp_var(share32_bad, share32a, 32) != 0);
            /* For B (claiming to be A): */
            ret = secp256k1_ellswift_xdh(CTX, share32_bad, ell64a, ell64b, sec32b, 0, hash_function, data);
            CHECK(ret);
            CHECK(secp256k1_memcmp_var(share32_bad, share32b, 32) != 0);
        }
    }

    /* Test hash initializers. */
    {
        secp256k1_sha256 sha, sha_optimized;
        static const unsigned char encode_tag[25] = "secp256k1_ellswift_encode";
        static const unsigned char create_tag[25] = "secp256k1_ellswift_create";
        static const unsigned char bip324_tag[26] = "bip324_ellswift_xonly_ecdh";

        /* Check that hash initialized by
         * secp256k1_ellswift_sha256_init_encode has the expected
         * state. */
        secp256k1_sha256_initialize_tagged(&sha, encode_tag, sizeof(encode_tag));
        secp256k1_ellswift_sha256_init_encode(&sha_optimized);
        test_sha256_eq(&sha, &sha_optimized);

        /* Check that hash initialized by
         * secp256k1_ellswift_sha256_init_create has the expected
         * state. */
        secp256k1_sha256_initialize_tagged(&sha, create_tag, sizeof(create_tag));
        secp256k1_ellswift_sha256_init_create(&sha_optimized);
        test_sha256_eq(&sha, &sha_optimized);

        /* Check that hash initialized by
         * secp256k1_ellswift_sha256_init_bip324 has the expected
         * state. */
        secp256k1_sha256_initialize_tagged(&sha, bip324_tag, sizeof(bip324_tag));
        secp256k1_ellswift_sha256_init_bip324(&sha_optimized);
        test_sha256_eq(&sha, &sha_optimized);
    }
}